

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O2

void __thiscall FFlatVertexBuffer::CreateFlatVBO(FFlatVertexBuffer *this)

{
  sector_t *psVar1;
  extsector_t *peVar2;
  F3DFloor *pFVar3;
  ulong uVar4;
  sector_t *psVar5;
  ulong uVar6;
  uint j;
  ulong uVar7;
  int i;
  long lVar8;
  long lVar9;
  int h;
  uint uVar10;
  long lVar11;
  
  for (uVar10 = 0; psVar5 = sectors, uVar10 != 2; uVar10 = uVar10 + 1) {
    lVar11 = 0xd8;
    if (uVar10 == 0) {
      lVar11 = 0xb0;
    }
    lVar9 = 0;
    for (lVar8 = 0; lVar8 < numsectors; lVar8 = lVar8 + 1) {
      psVar5 = (sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar9);
      CreateVertices(this,uVar10,psVar5,
                     (secplane_t *)((long)&psVar5->planes[0].xform.xOffs + lVar11),uVar10 ^ 1);
      lVar9 = lVar9 + 0x268;
    }
  }
  uVar6 = 0;
  uVar4 = (ulong)(uint)numsectors;
  if (numsectors < 1) {
    uVar4 = uVar6;
  }
  for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
    psVar1 = psVar5 + uVar6;
    peVar2 = psVar5[uVar6].e;
    uVar10 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      pFVar3 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar7];
      if ((pFVar3->top).model == psVar1) {
        (pFVar3->top).vindex = psVar1->vboindex[(pFVar3->top).isceiling];
      }
      if ((pFVar3->bottom).model == psVar1) {
        (pFVar3->bottom).vindex = psVar1->vboindex[(pFVar3->top).isceiling];
      }
    }
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CreateFlatVBO()
{
	for (int h = sector_t::floor; h <= sector_t::ceiling; h++)
	{
		for(int i=0; i<numsectors;i++)
		{
			CreateVertices(h, &sectors[i], sectors[i].GetSecPlane(h), h == sector_t::floor);
		}
	}

	// We need to do a final check for Vavoom water and FF_FIX sectors.
	// No new vertices are needed here. The planes come from the actual sector
	for(int i=0; i<numsectors;i++)
	{
		for(unsigned j=0;j<sectors[i].e->XFloor.ffloors.Size(); j++)
		{
			F3DFloor *ff = sectors[i].e->XFloor.ffloors[j];

			if (ff->top.model == &sectors[i])
			{
				ff->top.vindex = sectors[i].vboindex[ff->top.isceiling];
			}
			if (ff->bottom.model == &sectors[i])
			{
				ff->bottom.vindex = sectors[i].vboindex[ff->top.isceiling];
			}
		}
	}
}